

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

void __thiscall CVmObjGramProd::notify_delete(CVmObjGramProd *this,int param_1)

{
  void *__ptr;
  CVmGramProdMem *this_00;
  char *pcVar1;
  
  pcVar1 = (this->super_CVmObject).ext_;
  if (pcVar1 != (char *)0x0) {
    __ptr = *(void **)(pcVar1 + 0x30);
    if (__ptr != (void *)0x0) {
      clear_alts(this);
      free(__ptr);
      pcVar1 = (this->super_CVmObject).ext_;
    }
    this_00 = *(CVmGramProdMem **)(pcVar1 + 0x18);
    if (this_00 != (CVmGramProdMem *)0x0) {
      CVmGramProdMem::~CVmGramProdMem(this_00);
    }
    operator_delete(this_00,0x20);
    free(*(void **)((this->super_CVmObject).ext_ + 0x20));
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,(this->super_CVmObject).ext_);
    return;
  }
  return;
}

Assistant:

void CVmObjGramProd::notify_delete(VMG_ int /*in_root_set*/)
{
    /* free our additional data */
    if (ext_ != 0)
    {
        /* if we've allocated alternatives, delete them */
        vmgram_alt_info **alts = get_ext()->alts_;
        if (alts != 0)
        {
            /* delete the alternative objects */
            clear_alts();

            /* free the alternative array itself */
            t3free(alts);
        }

        /* delete our memory pool */
        delete get_ext()->mem_;

        /* delete our property enumeration space */
        t3free(get_ext()->prop_enum_arr_);
        
        /* free the extension */
        G_mem->get_var_heap()->free_mem(ext_);
    }
}